

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int str_find_aux(lua_State *L,int find)

{
  TValue *pTVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  GCstr *pGVar5;
  GCstr *s_00;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  char *q_1;
  char *pcStack_2a8;
  int anchor;
  char *sstr;
  char *pstr;
  MatchState ms;
  char *q;
  MSize st;
  int32_t start;
  GCstr *p;
  GCstr *s;
  int find_local;
  lua_State *L_local;
  
  pGVar5 = lj_lib_checkstr(L,1);
  s_00 = lj_lib_checkstr(L,2);
  iVar2 = lj_lib_optint(L,3,1);
  if (iVar2 < 0) {
    q._4_4_ = pGVar5->len + iVar2;
  }
  else {
    q._4_4_ = iVar2 - 1;
  }
  if ((int)q._4_4_ < 0) {
    q._4_4_ = 0;
  }
  q._0_4_ = q._4_4_;
  if (pGVar5->len < q._4_4_) {
    q._0_4_ = pGVar5->len;
  }
  iVar4 = (int)pGVar5;
  if ((find == 0) ||
     (((L->top <= L->base + 3 || (0xfffffffd < (uint)((int)L->base[3].field_4.it >> 0xf))) &&
      (iVar3 = lj_str_haspattern(s_00), iVar3 != 0)))) {
    sstr = (char *)(s_00 + 1);
    bVar8 = (char)(((GCstr *)sstr)->nextgc).gcptr64 == '^';
    if (bVar8) {
      sstr = (char *)((long)&s_00[1].nextgc.gcptr64 + 1);
    }
    pstr = (char *)(pGVar5 + 1);
    ms.src_init = (char *)((long)&pGVar5[1].nextgc.gcptr64 + (ulong)pGVar5->len);
    pcStack_2a8 = (char *)((long)&pGVar5[1].nextgc.gcptr64 + (ulong)(MSize)q);
    ms.src_end = (char *)L;
    do {
      ms.L._4_4_ = 0;
      ms.L._0_4_ = 0;
      pcVar6 = match((MatchState *)&pstr,pcStack_2a8,sstr);
      if (pcVar6 != (char *)0x0) {
        if (find != 0) {
          pTVar1 = L->top;
          L->top = pTVar1 + 1;
          pTVar1->n = (double)((int)pcStack_2a8 - (iVar4 + 0x17));
          pTVar1 = L->top;
          L->top = pTVar1 + 1;
          pTVar1->n = (double)((int)pcVar6 - (iVar4 + 0x18));
          iVar4 = push_captures((MatchState *)&pstr,(char *)0x0,(char *)0x0);
          return iVar4 + 2;
        }
        iVar4 = push_captures((MatchState *)&pstr,pcStack_2a8,pcVar6);
        return iVar4;
      }
      bVar7 = pcStack_2a8 < ms.src_init;
      pcStack_2a8 = pcStack_2a8 + 1;
    } while (bVar7 && !bVar8);
  }
  else {
    pcVar6 = lj_str_find((char *)((long)&pGVar5[1].nextgc.gcptr64 + (ulong)(MSize)q),
                         (char *)(s_00 + 1),pGVar5->len - (MSize)q,s_00->len);
    if (pcVar6 != (char *)0x0) {
      L->top[-2].n = (double)(((int)pcVar6 - (iVar4 + 0x18)) + 1);
      L->top[-1].n = (double)(int)(((int)pcVar6 - (iVar4 + 0x18)) + s_00->len);
      return 2;
    }
  }
  L->top[-1].u64 = 0xffffffffffffffff;
  return 1;
}

Assistant:

static int str_find_aux(lua_State *L, int find)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  GCstr *p = lj_lib_checkstr(L, 2);
  int32_t start = lj_lib_optint(L, 3, 1);
  MSize st;
  if (start < 0) start += (int32_t)s->len; else start--;
  if (start < 0) start = 0;
  st = (MSize)start;
  if (st > s->len) {
#if LJ_52
    setnilV(L->top-1);
    return 1;
#else
    st = s->len;
#endif
  }
  if (find && ((L->base+3 < L->top && tvistruecond(L->base+3)) ||
	       !lj_str_haspattern(p))) {  /* Search for fixed string. */
    const char *q = lj_str_find(strdata(s)+st, strdata(p), s->len-st, p->len);
    if (q) {
      setintV(L->top-2, (int32_t)(q-strdata(s)) + 1);
      setintV(L->top-1, (int32_t)(q-strdata(s)) + (int32_t)p->len);
      return 2;
    }
  } else {  /* Search for pattern. */
    MatchState ms;
    const char *pstr = strdata(p);
    const char *sstr = strdata(s) + st;
    int anchor = 0;
    if (*pstr == '^') { pstr++; anchor = 1; }
    ms.L = L;
    ms.src_init = strdata(s);
    ms.src_end = strdata(s) + s->len;
    do {  /* Loop through string and try to match the pattern. */
      const char *q;
      ms.level = ms.depth = 0;
      q = match(&ms, sstr, pstr);
      if (q) {
	if (find) {
	  setintV(L->top++, (int32_t)(sstr-(strdata(s)-1)));
	  setintV(L->top++, (int32_t)(q-strdata(s)));
	  return push_captures(&ms, NULL, NULL) + 2;
	} else {
	  return push_captures(&ms, sstr, q);
	}
      }
    } while (sstr++ < ms.src_end && !anchor);
  }
  setnilV(L->top-1);  /* Not found. */
  return 1;
}